

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

Status __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::varStatusToBasisStatusCol
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int col,VarStatus stat)

{
  ostream *poVar1;
  SPxInternalCodeException *this_00;
  int in_EDX;
  Status cstat;
  int in_stack_000000b4;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000000b8;
  string *in_stack_ffffffffffffff88;
  allocator local_39;
  string local_38 [36];
  Status local_14;
  int local_10;
  
  switch(in_EDX) {
  case 0:
    local_14 = P_ON_UPPER;
    break;
  case 1:
    local_14 = P_ON_LOWER;
    break;
  case 2:
    local_14 = P_FIXED;
    break;
  case 3:
    local_14 = P_FREE;
    break;
  case 4:
    local_14 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::dualColStatus(in_stack_000000b8,in_stack_000000b4);
    break;
  default:
    local_10 = in_EDX;
    poVar1 = std::operator<<((ostream *)&std::cerr,"ESOLVE28 ERROR: unknown VarStatus (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    poVar1 = std::operator<<(poVar1,")");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"XSOLVE24 This should never happen.",&local_39);
    SPxInternalCodeException::SPxInternalCodeException(this_00,in_stack_ffffffffffffff88);
    __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,
                SPxInternalCodeException::~SPxInternalCodeException);
  }
  return local_14;
}

Assistant:

typename SPxBasisBase<R>::Desc::Status
   SPxSolverBase<R>::varStatusToBasisStatusCol(int col,
         typename SPxSolverBase<R>::VarStatus stat) const
   {
      typename SPxBasisBase<R>::Desc::Status cstat;

      switch(stat)
      {
      case FIXED :
         cstat = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case ON_LOWER :
         cstat = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case ON_UPPER :
         cstat = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case ZERO :
         cstat = SPxBasisBase<R>::Desc::P_FREE;
         break;

      case BASIC :
         cstat = this->dualColStatus(col);
         break;

      default:
         SPX_MSG_ERROR(std::cerr << "ESOLVE28 ERROR: unknown VarStatus (" << int(stat) << ")"
                       << std::endl;)
         throw SPxInternalCodeException("XSOLVE24 This should never happen.");
      }

      return cstat;
   }